

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateFieldStoreWithTypeChange
          (Lowerer *this,Instr *instrStFld,PropertySymOpnd *propertySymOpnd,
          JITTypeHolder initialType,JITTypeHolder finalType)

{
  code *pcVar1;
  Lowerer *type;
  bool bVar2;
  TypeId typeId;
  uint32 offset;
  PropertyId PVar3;
  JITType *pJVar4;
  undefined4 *puVar5;
  PropertySym *pPVar6;
  intptr_t address;
  AddrOpnd *src;
  RegOpnd *baseOpnd_00;
  IndirOpnd *dst;
  JITTypeHandler *this_00;
  IntConstOpnd *opndArg;
  Instr *instr;
  Instr *invalidateCallInstr;
  bool isPrototypeTypeHandler;
  Opnd *opnd;
  RegOpnd *baseOpnd;
  Opnd *finalTypeOpnd;
  PropertySymOpnd *propertySymOpnd_local;
  Instr *instrStFld_local;
  Lowerer *this_local;
  JITTypeHolder finalType_local;
  JITTypeHolder initialType_local;
  
  this_local = (Lowerer *)finalType.t;
  finalType_local = initialType;
  GenerateAdjustSlots(this,instrStFld,propertySymOpnd,initialType,finalType);
  pJVar4 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&this_local);
  typeId = JITType::GetTypeId(pJVar4);
  bVar2 = Js::DynamicType::Is(typeId);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2078,"(Js::DynamicType::Is(finalType->GetTypeId()))",
                       "Js::DynamicType::Is(finalType->GetTypeId())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  type = this_local;
  pPVar6 = Sym::AsPropertySym((propertySymOpnd->super_SymOpnd).m_sym);
  PinTypeRef(this,(JITTypeHolder)type,type,instrStFld,pPVar6->m_propertyId);
  pJVar4 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&this_local);
  address = JITType::GetAddr(pJVar4);
  src = IR::AddrOpnd::New(address,AddrOpndKindDynamicType,instrStFld->m_func,true,(Var)0x0);
  baseOpnd_00 = IR::SymOpnd::CreatePropertyOwnerOpnd
                          (&propertySymOpnd->super_SymOpnd,instrStFld->m_func);
  offset = Js::RecyclableObject::GetOffsetOfType();
  dst = IR::IndirOpnd::New(baseOpnd_00,offset,TyInt64,instrStFld->m_func,false);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,instrStFld,true);
  GenerateDirectFieldStore(this,instrStFld,propertySymOpnd);
  pJVar4 = JITTypeHolderBase<void>::operator->(&finalType_local);
  this_00 = JITType::GetTypeHandler(pJVar4);
  bVar2 = JITTypeHandler::IsPrototype(this_00);
  if (bVar2) {
    LoadScriptContext(this,instrStFld);
    PVar3 = IR::PropertySymOpnd::GetPropertyId(propertySymOpnd);
    opndArg = IR::IntConstOpnd::New((long)PVar3,TyInt32,this->m_func,true);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instrStFld,&opndArg->super_Opnd);
    instr = IR::Instr::New(Call,this->m_func);
    IR::Instr::InsertBefore(instrStFld,instr);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr,HelperInvalidateProtoCaches,(LabelInstr *)0x0,(Opnd *)0x0,
               (PropertySymOpnd *)0x0,false);
  }
  return;
}

Assistant:

void
Lowerer::GenerateFieldStoreWithTypeChange(IR::Instr * instrStFld, IR::PropertySymOpnd *propertySymOpnd, JITTypeHolder initialType, JITTypeHolder finalType)
{
    // Adjust instance slots, if necessary.
    this->GenerateAdjustSlots(instrStFld, propertySymOpnd, initialType, finalType);

    // We should never add properties to objects of static types.
    Assert(Js::DynamicType::Is(finalType->GetTypeId()));

    // Let's pin the final type to be sure its alive when we try to do the type transition.
    PinTypeRef(finalType, finalType.t, instrStFld, propertySymOpnd->m_sym->AsPropertySym()->m_propertyId);
    IR::Opnd *finalTypeOpnd = IR::AddrOpnd::New(finalType->GetAddr(), IR::AddrOpndKindDynamicType, instrStFld->m_func, true);

    // Set the new type.
    IR::RegOpnd *baseOpnd = propertySymOpnd->CreatePropertyOwnerOpnd(instrStFld->m_func);
    IR::Opnd *opnd = IR::IndirOpnd::New(baseOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, instrStFld->m_func);
    this->InsertMove(opnd, finalTypeOpnd, instrStFld);

    // Now do the store.
    GenerateDirectFieldStore(instrStFld, propertySymOpnd);

    bool isPrototypeTypeHandler = initialType->GetTypeHandler()->IsPrototype();
    if (isPrototypeTypeHandler)
    {
        LoadScriptContext(instrStFld);
        m_lowererMD.LoadHelperArgument(instrStFld, IR::IntConstOpnd::New(propertySymOpnd->GetPropertyId(), TyInt32, m_func, true));
        IR::Instr * invalidateCallInstr = IR::Instr::New(Js::OpCode::Call, m_func);
        instrStFld->InsertBefore(invalidateCallInstr);
        m_lowererMD.ChangeToHelperCall(invalidateCallInstr, IR::HelperInvalidateProtoCaches);
    }
}